

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cl_parser.cpp
# Opt level: O3

void __thiscall ClParser_Modifiers_Test::TestBody(ClParser_Modifiers_Test *this)

{
  string *psVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  AssertHelper local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  undefined1 local_118 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  num_occurrences_flag local_f4;
  undefined1 local_f0 [144];
  undefined **local_60;
  pointer local_58;
  pointer plStack_50;
  pointer local_48;
  string local_40;
  
  pstore::command_line::option::option((option *)local_f0);
  local_f0._0_8_ = &PTR__opt_001ab018;
  local_f0._136_4_ = 0;
  local_58 = (pointer)0x0;
  plStack_50 = (pointer)0x0;
  local_48 = (pointer)0x0;
  local_60 = &PTR__parser_001aaf60;
  local_128.data_._0_4_ = pstore::command_line::option::get_num_occurrences_flag((option *)local_f0)
  ;
  local_f4 = optional;
  testing::internal::
  CmpHelperEQ<pstore::command_line::num_occurrences_flag,pstore::command_line::num_occurrences_flag>
            ((internal *)local_118,"opt<int> ().get_num_occurrences_flag ()",
             "num_occurrences_flag::optional",(num_occurrences_flag *)&local_128,&local_f4);
  pstore::command_line::parser<std::__cxx11::string,void>::~parser
            ((parser<std::__cxx11::string,void> *)&local_60);
  pstore::command_line::option::~option((option *)local_f0);
  if (local_118[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_f0);
    if (local_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_110->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_cl_parser.cpp"
               ,0x71,pcVar2);
    testing::internal::AssertHelper::operator=(&local_128,(Message *)local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_f0._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(_func_int **)local_f0._0_8_ + 8))();
    }
  }
  if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_110,local_110);
  }
  pstore::command_line::opt<int,_pstore::command_line::parser<int,_void>_>::
  opt<pstore::command_line::details::optional>
            ((opt<int,_pstore::command_line::parser<int,_void>_> *)local_f0,
             (optional *)&pstore::command_line::optional);
  local_128.data_._0_4_ = pstore::command_line::option::get_num_occurrences_flag((option *)local_f0)
  ;
  local_f4 = optional;
  testing::internal::
  CmpHelperEQ<pstore::command_line::num_occurrences_flag,pstore::command_line::num_occurrences_flag>
            ((internal *)local_118,"opt<int>{optional}.get_num_occurrences_flag ()",
             "num_occurrences_flag::optional",(num_occurrences_flag *)&local_128,&local_f4);
  pstore::command_line::parser<std::__cxx11::string,void>::~parser
            ((parser<std::__cxx11::string,void> *)&local_60);
  pstore::command_line::option::~option((option *)local_f0);
  if (local_118[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_f0);
    if (local_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_110->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_cl_parser.cpp"
               ,0x72,pcVar2);
    testing::internal::AssertHelper::operator=(&local_128,(Message *)local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_f0._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(_func_int **)local_f0._0_8_ + 8))();
    }
  }
  if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_110,local_110);
  }
  pstore::command_line::opt<int,_pstore::command_line::parser<int,_void>_>::
  opt<pstore::command_line::details::required>
            ((opt<int,_pstore::command_line::parser<int,_void>_> *)local_f0,
             (required *)&pstore::command_line::required);
  local_128.data_._0_4_ = pstore::command_line::option::get_num_occurrences_flag((option *)local_f0)
  ;
  local_f4 = required;
  testing::internal::
  CmpHelperEQ<pstore::command_line::num_occurrences_flag,pstore::command_line::num_occurrences_flag>
            ((internal *)local_118,"opt<int>{required}.get_num_occurrences_flag ()",
             "num_occurrences_flag::required",(num_occurrences_flag *)&local_128,&local_f4);
  pstore::command_line::parser<std::__cxx11::string,void>::~parser
            ((parser<std::__cxx11::string,void> *)&local_60);
  pstore::command_line::option::~option((option *)local_f0);
  if (local_118[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_f0);
    if (local_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_110->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_cl_parser.cpp"
               ,0x73,pcVar2);
    testing::internal::AssertHelper::operator=(&local_128,(Message *)local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_f0._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(_func_int **)local_f0._0_8_ + 8))();
    }
  }
  if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_110,local_110);
  }
  pstore::command_line::opt<int,_pstore::command_line::parser<int,_void>_>::
  opt<pstore::command_line::details::one_or_more>
            ((opt<int,_pstore::command_line::parser<int,_void>_> *)local_f0,
             (one_or_more *)&pstore::command_line::one_or_more);
  local_128.data_._0_4_ = pstore::command_line::option::get_num_occurrences_flag((option *)local_f0)
  ;
  local_f4 = zero_or_more;
  testing::internal::
  CmpHelperEQ<pstore::command_line::num_occurrences_flag,pstore::command_line::num_occurrences_flag>
            ((internal *)local_118,"opt<int>{one_or_more}.get_num_occurrences_flag ()",
             "num_occurrences_flag::zero_or_more",(num_occurrences_flag *)&local_128,&local_f4);
  pstore::command_line::parser<std::__cxx11::string,void>::~parser
            ((parser<std::__cxx11::string,void> *)&local_60);
  pstore::command_line::option::~option((option *)local_f0);
  if (local_118[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_f0);
    if (local_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_110->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_cl_parser.cpp"
               ,0x75,pcVar2);
    testing::internal::AssertHelper::operator=(&local_128,(Message *)local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_f0._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(_func_int **)local_f0._0_8_ + 8))();
    }
  }
  if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_110,local_110);
  }
  pstore::command_line::opt<int,pstore::command_line::parser<int,void>>::
  opt<pstore::command_line::details::required,pstore::command_line::details::one_or_more>
            ((opt<int,pstore::command_line::parser<int,void>> *)local_f0,
             (required *)&pstore::command_line::required,
             (one_or_more *)&pstore::command_line::one_or_more);
  local_128.data_._0_4_ = pstore::command_line::option::get_num_occurrences_flag((option *)local_f0)
  ;
  local_f4 = one_or_more;
  testing::internal::
  CmpHelperEQ<pstore::command_line::num_occurrences_flag,pstore::command_line::num_occurrences_flag>
            ((internal *)local_118,"opt<int> (required, one_or_more).get_num_occurrences_flag ()",
             "num_occurrences_flag::one_or_more",(num_occurrences_flag *)&local_128,&local_f4);
  pstore::command_line::parser<std::__cxx11::string,void>::~parser
            ((parser<std::__cxx11::string,void> *)&local_60);
  pstore::command_line::option::~option((option *)local_f0);
  if (local_118[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_f0);
    if (local_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_110->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_cl_parser.cpp"
               ,0x77,pcVar2);
    testing::internal::AssertHelper::operator=(&local_128,(Message *)local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_f0._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(_func_int **)local_f0._0_8_ + 8))();
    }
  }
  if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_110,local_110);
  }
  pstore::command_line::opt<int,pstore::command_line::parser<int,void>>::
  opt<pstore::command_line::details::optional,pstore::command_line::details::one_or_more>
            ((opt<int,pstore::command_line::parser<int,void>> *)local_f0,
             (optional *)&pstore::command_line::optional,
             (one_or_more *)&pstore::command_line::one_or_more);
  local_128.data_._0_4_ = pstore::command_line::option::get_num_occurrences_flag((option *)local_f0)
  ;
  local_f4 = zero_or_more;
  testing::internal::
  CmpHelperEQ<pstore::command_line::num_occurrences_flag,pstore::command_line::num_occurrences_flag>
            ((internal *)local_118,"opt<int> (optional, one_or_more).get_num_occurrences_flag ()",
             "num_occurrences_flag::zero_or_more",(num_occurrences_flag *)&local_128,&local_f4);
  pstore::command_line::parser<std::__cxx11::string,void>::~parser
            ((parser<std::__cxx11::string,void> *)&local_60);
  pstore::command_line::option::~option((option *)local_f0);
  if (local_118[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_f0);
    if (local_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_110->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_cl_parser.cpp"
               ,0x79,pcVar2);
    testing::internal::AssertHelper::operator=(&local_128,(Message *)local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_f0._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(_func_int **)local_f0._0_8_ + 8))();
    }
  }
  if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_110,local_110);
  }
  pstore::command_line::option::option((option *)local_f0);
  local_f0._0_8_ = &PTR__opt_001ab018;
  local_f0._136_4_ = 0;
  local_58 = (pointer)0x0;
  plStack_50 = (pointer)0x0;
  local_48 = (pointer)0x0;
  local_60 = &PTR__parser_001aaf60;
  psVar1 = pstore::command_line::option::name_abi_cxx11_((option *)local_f0);
  pcVar2 = "";
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[1]>
            ((internal *)local_118,"opt<int> ().name ()","\"\"",psVar1,(char (*) [1])0x17fd7e);
  pstore::command_line::parser<std::__cxx11::string,void>::~parser
            ((parser<std::__cxx11::string,void> *)&local_60);
  pstore::command_line::option::~option((option *)local_f0);
  if (local_118[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_f0);
    if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = (local_110->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_cl_parser.cpp"
               ,0x7b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_128,(Message *)local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_f0._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(_func_int **)local_f0._0_8_ + 8))();
    }
  }
  if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_110,local_110);
  }
  pstore::command_line::opt<int,_pstore::command_line::parser<int,_void>_>::opt<char[5]>
            ((opt<int,_pstore::command_line::parser<int,_void>_> *)local_f0,(char (*) [5])0x17ca1d);
  psVar1 = pstore::command_line::option::name_abi_cxx11_((option *)local_f0);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            ((internal *)local_118,"opt<int>{\"name\"}.name ()","\"name\"",psVar1,
             (char (*) [5])0x17ca1d);
  pstore::command_line::parser<std::__cxx11::string,void>::~parser
            ((parser<std::__cxx11::string,void> *)&local_60);
  pstore::command_line::option::~option((option *)local_f0);
  if (local_118[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_f0);
    if (local_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_110->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_cl_parser.cpp"
               ,0x7c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_128,(Message *)local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_f0._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(_func_int **)local_f0._0_8_ + 8))();
    }
  }
  if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_110,local_110);
  }
  pstore::command_line::option::option((option *)local_f0);
  local_f0._0_8_ = &PTR__opt_001ab018;
  local_f0._136_4_ = 0;
  local_58 = (pointer)0x0;
  plStack_50 = (pointer)0x0;
  local_48 = (pointer)0x0;
  local_60 = &PTR__parser_001aaf60;
  psVar1 = pstore::command_line::option::description_abi_cxx11_((option *)local_f0);
  pcVar2 = "";
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[1]>
            ((internal *)local_118,"opt<int>{}.description ()","\"\"",psVar1,(char (*) [1])0x17fd7e)
  ;
  pstore::command_line::parser<std::__cxx11::string,void>::~parser
            ((parser<std::__cxx11::string,void> *)&local_60);
  pstore::command_line::option::~option((option *)local_f0);
  if (local_118[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_f0);
    if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = (local_110->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_cl_parser.cpp"
               ,0x7e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_128,(Message *)local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_f0._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(_func_int **)local_f0._0_8_ + 8))();
    }
  }
  if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_110,local_110);
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"description","");
  pstore::command_line::desc::desc((desc *)local_118,&local_40);
  pstore::command_line::opt<int,_pstore::command_line::parser<int,_void>_>::
  opt<pstore::command_line::desc>
            ((opt<int,_pstore::command_line::parser<int,_void>_> *)local_f0,(desc *)local_118);
  psVar1 = pstore::command_line::option::description_abi_cxx11_((option *)local_f0);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[12]>
            ((internal *)&local_128,"opt<int>{desc (\"description\")}.description ()",
             "\"description\"",psVar1,(char (*) [12])0x17cd5f);
  pstore::command_line::parser<std::__cxx11::string,void>::~parser
            ((parser<std::__cxx11::string,void> *)&local_60);
  pstore::command_line::option::~option((option *)local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_118._1_7_,local_118[0]) != &local_108) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_118._1_7_,local_118[0]),local_108._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_128.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_f0);
    if (local_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_cl_parser.cpp"
               ,0x7f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_118,(Message *)local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_118);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(_func_int **)local_f0._0_8_ + 8))();
    }
  }
  if (local_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_120,local_120);
  }
  return;
}

Assistant:

TEST (ClParser, Modifiers) {
    using namespace pstore::command_line;
    EXPECT_EQ (opt<int> ().get_num_occurrences_flag (), num_occurrences_flag::optional);
    EXPECT_EQ (opt<int>{optional}.get_num_occurrences_flag (), num_occurrences_flag::optional);
    EXPECT_EQ (opt<int>{required}.get_num_occurrences_flag (), num_occurrences_flag::required);
    EXPECT_EQ (opt<int>{one_or_more}.get_num_occurrences_flag (),
               num_occurrences_flag::zero_or_more);
    EXPECT_EQ (opt<int> (required, one_or_more).get_num_occurrences_flag (),
               num_occurrences_flag::one_or_more);
    EXPECT_EQ (opt<int> (optional, one_or_more).get_num_occurrences_flag (),
               num_occurrences_flag::zero_or_more);

    EXPECT_EQ (opt<int> ().name (), "");
    EXPECT_EQ (opt<int>{"name"}.name (), "name");

    EXPECT_EQ (opt<int>{}.description (), "");
    EXPECT_EQ (opt<int>{desc ("description")}.description (), "description");
}